

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::ParseContext<std::__cxx11::string&>
          (ParseContext *this,int depth,bool aliasing,char **start,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  StringPiece flat;
  char *pcVar1;
  EpsCopyInputStream *in_RCX;
  undefined1 in_DL;
  undefined4 in_ESI;
  EpsCopyInputStream *in_RDI;
  StringPiece *in_stack_ffffffffffffffd0;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  EpsCopyInputStream *pEVar3;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  pEVar3 = in_RDI;
  EpsCopyInputStream::EpsCopyInputStream(in_RDI,SUB41(uVar2 >> 0x18,0));
  *(undefined4 *)&in_RDI[1].limit_end_ = in_ESI;
  *(undefined4 *)((long)&in_RDI[1].limit_end_ + 4) = 0x80000000;
  Data::Data((Data *)&in_RDI[1].buffer_end_);
  StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffffd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  flat.ptr_._4_4_ = in_ESI;
  flat.ptr_._0_4_ = uVar2;
  flat.length_ = (stringpiece_ssize_type)pEVar3;
  pcVar1 = EpsCopyInputStream::InitFrom(in_RCX,flat);
  in_RCX->limit_end_ = pcVar1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }